

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txdb.cpp
# Opt level: O2

bool __thiscall
CCoinsViewDB::BatchWrite(CCoinsViewDB *this,CoinsViewCacheCursor *cursor,uint256 *hashBlock)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  bool bVar3;
  int iVar4;
  CoinsCachePair *pCVar5;
  size_type *psVar6;
  CoinsCachePair *pCVar7;
  Logger *pLVar8;
  int iVar9;
  uint uVar10;
  Level level;
  uint256 *puVar11;
  CoinsCachePair *current;
  CDBBatch *batch_00;
  char *__assertion;
  uint *in_R8;
  long in_FS_OFFSET;
  Span<const_std::byte> key;
  Span<const_std::byte> key_00;
  string_view str;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  char *in_stack_fffffffffffffe80;
  double *in_stack_fffffffffffffe88;
  uint local_160;
  int local_15c;
  CDBBatch batch;
  uint256 old_tip;
  string local_78;
  vector<uint256,_std::allocator<uint256>_> old_heads;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CDBBatch::CDBBatch(&batch,(this->m_db)._M_t.
                            super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t
                            .super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
                            super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl);
  bVar2 = base_blob<256U>::IsNull(&hashBlock->super_base_blob<256U>);
  if (bVar2) {
LAB_00896951:
    __assertion = "!hashBlock.IsNull()";
    uVar10 = 0x5f;
LAB_00896968:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txdb.cpp"
                  ,uVar10,
                  "virtual bool CCoinsViewDB::BatchWrite(CoinsViewCacheCursor &, const uint256 &)");
  }
  GetBestBlock(&old_tip,this);
  bVar2 = base_blob<256U>::IsNull(&old_tip.super_base_blob<256U>);
  if (bVar2) {
    GetHeadBlocks(&old_heads,this);
    if ((long)old_heads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)old_heads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_start == 0x40) {
      puVar11 = hashBlock;
      bVar2 = ::operator!=(&(old_heads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl
                             .super__Vector_impl_data._M_start)->super_base_blob<256U>,
                           &hashBlock->super_base_blob<256U>);
      if (bVar2) {
        bVar2 = ::LogAcceptCategory(MEMPOOL,(Level)puVar11);
        if (bVar2) {
          in_stack_fffffffffffffe80 =
               "The coins database detected an inconsistent state, likely due to a previous crash or shutdown. You will need to restart bitcoind with the -reindex-chainstate or -reindex configuration option.\n"
          ;
          in_R8 = (uint *)0x67;
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txdb.cpp";
          source_file_00._M_len = 0x51;
          logging_function._M_str = "BatchWrite";
          logging_function._M_len = 10;
          ::LogPrintf_<>(logging_function,source_file_00,0x67,COINDB,Error,
                         "The coins database detected an inconsistent state, likely due to a previous crash or shutdown. You will need to restart bitcoind with the -reindex-chainstate or -reindex configuration option.\n"
                        );
        }
      }
      bVar2 = ::operator==(&(old_heads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl
                             .super__Vector_impl_data._M_start)->super_base_blob<256U>,
                           &hashBlock->super_base_blob<256U>);
      if (!bVar2) {
        __assertion = "old_heads[0] == hashBlock";
        uVar10 = 0x69;
        goto LAB_00896968;
      }
      old_tip.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)
            old_heads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_start[1].super_base_blob<256U>.m_data._M_elems;
      old_tip.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)
            (old_heads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_start[1].super_base_blob<256U>.m_data._M_elems + 8);
      old_tip.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)
            (old_heads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_start[1].super_base_blob<256U>.m_data._M_elems + 0x10);
      old_tip.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)
            (old_heads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_start[1].super_base_blob<256U>.m_data._M_elems + 0x18);
    }
    std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
              (&old_heads.super__Vector_base<uint256,_std::allocator<uint256>_>);
  }
  CDBBatch::Erase<unsigned_char>(&batch,"BHC12CCoinsViewDB");
  Vector<uint256_const&,uint256&>(&old_heads,hashBlock,&old_tip);
  CDBBatch::Write<unsigned_char,std::vector<uint256,std::allocator<uint256>>>
            (&batch,"HC12CCoinsViewDB",
             (vector<uint256,_std::allocator<uint256>_> *)
             &old_heads.super__Vector_base<uint256,_std::allocator<uint256>_>);
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
            (&old_heads.super__Vector_base<uint256,_std::allocator<uint256>_>);
  pCVar5 = cursor->m_sentinel;
  iVar9 = 0;
  uVar10 = 0;
  current = (pCVar5->second).m_next;
  do {
    if (current == pCVar5) {
      CDBBatch::Erase<unsigned_char>(&batch,"HC12CCoinsViewDB");
      level = 0xce43bc;
      CDBBatch::Write<unsigned_char,uint256>(&batch,"BHC12CCoinsViewDB",hashBlock);
      bVar2 = ::LogAcceptCategory(NET,level);
      if (bVar2) {
        old_heads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((((double)CONCAT44(0x45300000,(int)(batch.size_estimate >> 0x20)) -
                        1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)batch.size_estimate) - 4503599627370496.0))
                      * 9.5367431640625e-07);
        in_R8 = (uint *)0x92;
        source_file_02._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txdb.cpp";
        source_file_02._M_len = 0x51;
        logging_function_01._M_str = "BatchWrite";
        logging_function_01._M_len = 10;
        LogPrintf_<double>(logging_function_01,source_file_02,0x92,
                           IPC|I2P|QT|COINDB|LIBEVENT|PRUNE|SELECTCOINS|ESTIMATEFEE|RPC|ZMQ|BENCH|
                           HTTP|MEMPOOL|TOR|NET,(Level)&old_heads,in_stack_fffffffffffffe80,
                           in_stack_fffffffffffffe88);
      }
      batch_00 = &batch;
      bVar2 = CDBWrapper::WriteBatch
                        ((this->m_db)._M_t.
                         super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
                         super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
                         super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl,batch_00,false);
      bVar3 = ::LogAcceptCategory(NET,(Level)batch_00);
      if (bVar3) {
        local_160 = uVar10;
        local_15c = iVar9;
        pLVar8 = LogInstance();
        bVar3 = BCLog::Logger::Enabled(pLVar8);
        if (bVar3) {
          old_heads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&old_heads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
          old_heads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          old_heads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          tinyformat::format<unsigned_int,unsigned_int>
                    (&local_78,
                     (tinyformat *)
                     "Committed %u changed transaction outputs (out of %u) to coin database...\n",
                     (char *)&local_15c,&local_160,in_R8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&old_heads
                     ,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          pLVar8 = LogInstance();
          local_78._M_dataplus._M_p = (pointer)0x51;
          local_78._M_string_length = 0xce43f7;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txdb.cpp";
          source_file._M_len = 0x51;
          str._M_str = (char *)old_heads.super__Vector_base<uint256,_std::allocator<uint256>_>.
                               _M_impl.super__Vector_impl_data._M_start;
          str._M_len = (size_t)old_heads.super__Vector_base<uint256,_std::allocator<uint256>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
          logging_function_03._M_str = "BatchWrite";
          logging_function_03._M_len = 10;
          BCLog::Logger::LogPrintStr(pLVar8,str,logging_function_03,source_file,0x94,COINDB,Debug);
          std::__cxx11::string::~string((string *)&old_heads);
        }
      }
      CDBBatch::~CDBBatch(&batch);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return bVar2;
      }
      __stack_chk_fail();
    }
    if (((current->second).m_flags & 1) != 0) {
      old_heads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)CONCAT71(old_heads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl
                             .super__Vector_impl_data._M_finish._1_7_,0x43);
      old_heads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)current;
      if ((current->second).coin.out.nValue == -1) {
        DataStream::reserve(&batch.ssKey,0x40);
        DataStream::operator<<(&batch.ssKey,(CoinEntry *)&old_heads);
        key_00.m_data =
             batch.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start + batch.ssKey.m_read_pos;
        key_00.m_size =
             (long)batch.ssKey.vch.
                   super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)key_00.m_data;
        CDBBatch::EraseImpl(&batch,key_00);
        psVar6 = &batch.ssKey.m_read_pos;
        if (batch.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            batch.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          batch.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               batch.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
      }
      else {
        DataStream::reserve(&batch.ssKey,0x40);
        DataStream::reserve(&batch.ssValue,0x400);
        DataStream::operator<<(&batch.ssKey,(CoinEntry *)&old_heads);
        Coin::Serialize<DataStream>(&(current->second).coin,&batch.ssValue);
        key.m_data = batch.ssKey.vch.
                     super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_start + batch.ssKey.m_read_pos;
        key.m_size = (long)batch.ssKey.vch.
                           super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)key.m_data;
        CDBBatch::WriteImpl(&batch,key,&batch.ssValue);
        if (batch.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            batch.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          batch.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               batch.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
        batch.ssKey.m_read_pos = 0;
        psVar6 = &batch.ssValue.m_read_pos;
        if (batch.ssValue.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            batch.ssValue.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          batch.ssValue.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               batch.ssValue.vch.
               super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
      }
      *psVar6 = 0;
      iVar9 = iVar9 + 1;
    }
    pCVar7 = CoinsViewCacheCursor::NextAndMaybeErase(cursor,current);
    if ((this->m_options).batch_write_bytes < batch.size_estimate) {
      bVar2 = ::LogAcceptCategory(NET,(Level)current);
      if (bVar2) {
        old_heads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((((double)CONCAT44(0x45300000,(int)(batch.size_estimate >> 0x20)) -
                        1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)batch.size_estimate) - 4503599627370496.0))
                      * 9.5367431640625e-07);
        in_R8 = (uint *)0x81;
        source_file_01._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txdb.cpp";
        source_file_01._M_len = 0x51;
        logging_function_00._M_str = "BatchWrite";
        logging_function_00._M_len = 10;
        LogPrintf_<double>(logging_function_00,source_file_01,0x81,
                           IPC|I2P|QT|COINDB|LIBEVENT|PRUNE|SELECTCOINS|ESTIMATEFEE|WALLETDB|ZMQ|
                           BENCH|HTTP|MEMPOOL|TOR,(Level)&old_heads,in_stack_fffffffffffffe80,
                           in_stack_fffffffffffffe88);
      }
      CDBWrapper::WriteBatch
                ((this->m_db)._M_t.
                 super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
                 super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
                 super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl,&batch,false);
      CDBBatch::Clear(&batch);
      if ((this->m_options).simulate_crash_ratio != 0) {
        if (BatchWrite(CoinsViewCacheCursor&,uint256_const&)::rng == '\0') {
          iVar4 = __cxa_guard_acquire(&BatchWrite(CoinsViewCacheCursor&,uint256_const&)::rng);
          if (iVar4 != 0) {
            FastRandomContext::FastRandomContext(&BatchWrite::rng,false);
            __cxa_atexit(FastRandomContext::~FastRandomContext,&BatchWrite::rng,&__dso_handle);
            __cxa_guard_release(&BatchWrite(CoinsViewCacheCursor&,uint256_const&)::rng);
          }
        }
        iVar4 = RandomMixin<FastRandomContext>::randrange<int>
                          (&BatchWrite::rng.super_RandomMixin<FastRandomContext>,
                           (this->m_options).simulate_crash_ratio);
        if (iVar4 == 0) {
          source_file_03._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txdb.cpp";
          source_file_03._M_len = 0x51;
          logging_function_02._M_str = "BatchWrite";
          logging_function_02._M_len = 10;
          ::LogPrintf_<>(logging_function_02,source_file_03,0x87,ALL,Info,
                         "Simulating a crash. Goodbye.\n");
          _Exit(0);
          goto LAB_00896951;
        }
      }
    }
    pCVar5 = cursor->m_sentinel;
    uVar10 = uVar10 + 1;
    current = pCVar7;
  } while( true );
}

Assistant:

bool CCoinsViewDB::BatchWrite(CoinsViewCacheCursor& cursor, const uint256 &hashBlock) {
    CDBBatch batch(*m_db);
    size_t count = 0;
    size_t changed = 0;
    assert(!hashBlock.IsNull());

    uint256 old_tip = GetBestBlock();
    if (old_tip.IsNull()) {
        // We may be in the middle of replaying.
        std::vector<uint256> old_heads = GetHeadBlocks();
        if (old_heads.size() == 2) {
            if (old_heads[0] != hashBlock) {
                LogPrintLevel(BCLog::COINDB, BCLog::Level::Error, "The coins database detected an inconsistent state, likely due to a previous crash or shutdown. You will need to restart bitcoind with the -reindex-chainstate or -reindex configuration option.\n");
            }
            assert(old_heads[0] == hashBlock);
            old_tip = old_heads[1];
        }
    }

    // In the first batch, mark the database as being in the middle of a
    // transition from old_tip to hashBlock.
    // A vector is used for future extensibility, as we may want to support
    // interrupting after partial writes from multiple independent reorgs.
    batch.Erase(DB_BEST_BLOCK);
    batch.Write(DB_HEAD_BLOCKS, Vector(hashBlock, old_tip));

    for (auto it{cursor.Begin()}; it != cursor.End();) {
        if (it->second.IsDirty()) {
            CoinEntry entry(&it->first);
            if (it->second.coin.IsSpent())
                batch.Erase(entry);
            else
                batch.Write(entry, it->second.coin);
            changed++;
        }
        count++;
        it = cursor.NextAndMaybeErase(*it);
        if (batch.SizeEstimate() > m_options.batch_write_bytes) {
            LogDebug(BCLog::COINDB, "Writing partial batch of %.2f MiB\n", batch.SizeEstimate() * (1.0 / 1048576.0));
            m_db->WriteBatch(batch);
            batch.Clear();
            if (m_options.simulate_crash_ratio) {
                static FastRandomContext rng;
                if (rng.randrange(m_options.simulate_crash_ratio) == 0) {
                    LogPrintf("Simulating a crash. Goodbye.\n");
                    _Exit(0);
                }
            }
        }
    }

    // In the last batch, mark the database as consistent with hashBlock again.
    batch.Erase(DB_HEAD_BLOCKS);
    batch.Write(DB_BEST_BLOCK, hashBlock);

    LogDebug(BCLog::COINDB, "Writing final batch of %.2f MiB\n", batch.SizeEstimate() * (1.0 / 1048576.0));
    bool ret = m_db->WriteBatch(batch);
    LogDebug(BCLog::COINDB, "Committed %u changed transaction outputs (out of %u) to coin database...\n", (unsigned int)changed, (unsigned int)count);
    return ret;
}